

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  bool bVar1;
  cmake *this_00;
  bool local_39;
  cmake *cm;
  cmValue val;
  string *var_local;
  cmMakefile *this_local;
  
  val.Value = var;
  cm = (cmake *)GetDefinition(this,var);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&cm);
  if (bVar1) {
    this_local._7_1_ = cmValue::IsOn((cmValue *)&cm);
  }
  else {
    this_00 = GetCMakeInstance(this);
    bVar1 = cmake::GetDebugOutput(this_00);
    local_39 = true;
    if (!bVar1) {
      local_39 = cmake::GetTrace(this_00);
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var) const
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if (cmValue val = this->GetDefinition(var)) {
    return val.IsOn();
  }
  // Enable optional policy warnings with --debug-output, --trace,
  // or --trace-expand.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}